

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  pointer *ppuVar2;
  size_type *psVar3;
  __node_base_ptr *__dest;
  __node_base_ptr *pp_Var4;
  pointer pcVar5;
  Value *pVVar6;
  element_type *peVar7;
  Value *this;
  pointer pRVar8;
  int *piVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  char *pcVar11;
  int *piVar12;
  char cVar13;
  bool bVar14;
  string *psVar15;
  mapped_type *pmVar16;
  Ref *pRVar17;
  size_t sVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  const_iterator cVar21;
  ostream *poVar22;
  long lVar23;
  pointer *__k;
  ulong uVar24;
  undefined8 this_00;
  IString x;
  IString x_00;
  undefined1 auVar25 [16];
  IString x_01;
  IString x_02;
  IString x_03;
  IString x_04;
  undefined1 local_cb8 [8];
  Module wasm;
  ToolOptions options;
  MetaDCEGraph graph;
  __node_base_ptr local_538;
  undefined8 local_530;
  code *local_528;
  code *local_520;
  size_type **local_518;
  undefined8 local_510;
  code *local_508;
  code *local_500;
  __buckets_ptr local_4f8;
  undefined8 local_4f0;
  code *local_4e8;
  code *local_4e0;
  _Prime_rehash_policy local_4d8;
  code *local_4c8;
  code *local_4c0;
  undefined1 auStack_4b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  ImportId id;
  undefined1 local_488;
  undefined7 uStack_487;
  undefined1 *local_478;
  undefined8 local_470;
  undefined1 local_468;
  undefined7 uStack_467;
  undefined1 *local_458;
  undefined8 local_450;
  undefined1 local_448;
  undefined7 uStack_447;
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  ulong local_278;
  ulong local_270;
  char *local_268;
  long *local_260 [2];
  long local_250 [2];
  long *local_240 [2];
  long local_230 [2];
  long *local_220 [2];
  long local_210 [2];
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0 [2];
  long local_1d0 [2];
  long *local_1c0 [2];
  long local_1b0 [2];
  long *local_1a0 [2];
  long local_190 [2];
  long *local_180 [2];
  long local_170 [2];
  size_type *local_160;
  string graphFile;
  size_type *local_f0;
  string WasmMetaDCEOption;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  Value outside;
  size_type *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> graphInput;
  undefined1 auStack_68 [8];
  DCENode node;
  undefined1 local_33 [2];
  undefined1 local_31;
  bool emitBinary;
  bool dump;
  bool debugInfo;
  
  id.super_IString.str._M_len =
       (size_t)passes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auStack_4b8 = (undefined1  [8])0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_33[0] = 1;
  local_31 = 0;
  local_160 = &graphFile._M_string_length;
  graphFile._M_dataplus._M_p = (pointer)0x0;
  graphFile._M_string_length._0_1_ = 0;
  local_33[1] = '\0';
  local_f0 = &WasmMetaDCEOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"wasm-opt options","");
  ppuVar2 = &wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_cb8 = (undefined1  [8])ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"wasm-metadce","");
  psVar3 = &graph.nodes._M_h._M_bucket_count;
  options._352_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,
             "This tool performs dead code elimination (DCE) on a larger space that the wasm module is just a part of. For example, if you have JS and wasm that are connected, this can DCE the combined graph. By doing so, it is able to eliminate wasm module exports, which otherwise regular optimizations cannot.\n\nThis tool receives a representation of the reachability graph that the wasm module resides in, which contains abstract nodes and connections showing what they reach. Some of those nodes can represent the wasm module\'s imports and exports. The tool then completes the graph by adding the internal parts of the module, and does DCE on the entire thing.\n\nThis tool will output a wasm module with dead code eliminated, and metadata describing the things in the rest of the graph that can be eliminated as well.\n\nThe graph description file should represent the graph in the following JSON-like notation (note, this is not true JSON, things like comments, escaping, single-quotes, etc. are not supported):\n\n  [\n    {\n      \"name\": \"entity1\",\n      \"reaches\": [\"entity2, \"entity3\"],\n      \"root\": true\n    },\n    {\n      \"name\": \"entity2\",\n      \"reaches\": [\"entity1, \"entity4\"]\n    },\n    {\n      \"name\": \"entity3\",\n      \"reaches\": [\"entity1\"],\n      \"export\": \"export1\"\n    },\n    {\n      \"name\": \"entity4\",\n      \"import\": [\"module\", \"import1\"]\n    },\n  ]\n\nEach entity has a name and an optional list of the other entities it reaches. It can also be marked as a root, export (with the export string), or import (with the module and import strings). DCE then computes what is reachable from the roots."
             ,"");
  ::wasm::ToolOptions::ToolOptions
            ((ToolOptions *)&wasm.tagsMap._M_h._M_single_bucket,(string *)local_cb8,
             (string *)&options.enabledFeatures);
  if ((size_type *)options._352_8_ != psVar3) {
    operator_delete((void *)options._352_8_,graph.nodes._M_h._M_bucket_count + 1);
  }
  if (local_cb8 != (undefined1  [8])ppuVar2) {
    operator_delete((void *)local_cb8,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  local_cb8 = (undefined1  [8])ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"--output","");
  options._352_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"-o","");
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&id.super_IString.str._M_str;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "Output file (stdout if not specified)","");
  auStack_68 = (undefined1  [8])0x0;
  node.name.super_IString.str._M_len = 0;
  node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:480:10)>
                ::_M_invoke;
  node.name.super_IString.str._M_str =
       (char *)std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:480:10)>
               ::_M_manager;
  psVar15 = (string *)
            ::wasm::Options::add
                      ((string *)&wasm.tagsMap._M_h._M_single_bucket,(string *)local_cb8,
                       (string *)&options.enabledFeatures,
                       (string *)
                       &passes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Arguments)&local_f0,
                       (function *)0x1,SUB81(auStack_68,0));
  WasmMetaDCEOption.field_2._8_8_ = &input._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmMetaDCEOption.field_2 + 8),"--emit-text","");
  local_90 = &graphInput._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-S","");
  input.field_2._8_8_ = &outside.field_1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&input.field_2 + 8),"Emit text instead of binary for the output file",
             "");
  graph.reached._M_h._M_single_bucket = (__node_base_ptr)local_33;
  psVar15 = (string *)
            ::wasm::Options::add
                      (psVar15,(string *)(WasmMetaDCEOption.field_2._M_local_buf + 8),
                       (string *)&local_90,(string *)(input.field_2._M_local_buf + 8),
                       (Arguments)&local_f0,(function *)0x0,(bool)((char)&graph + -0x58));
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"--debuginfo","");
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"-g","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"Emit names section and debug info","");
  local_530 = 0;
  local_538 = (__node_base_ptr)&stack0xffffffffffffffcf;
  local_520 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:495:10)>
              ::_M_invoke;
  local_528 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:495:10)>
              ::_M_manager;
  psVar15 = (string *)
            ::wasm::Options::add
                      (psVar15,(string *)local_260,(string *)local_240,(string *)local_220,
                       (Arguments)&local_f0,(function *)0x0,SUB81(&local_538,0));
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"--graph-file","");
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"-f","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"Filename of the graph description file","");
  local_510 = 0;
  local_518 = &local_160;
  local_500 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:501:10)>
              ::_M_invoke;
  local_508 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:501:10)>
              ::_M_manager;
  psVar15 = (string *)
            ::wasm::Options::add
                      (psVar15,(string *)local_200,(string *)local_1e0,(string *)local_1c0,
                       (Arguments)&local_f0,(function *)0x1,SUB81(&local_518,0));
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"--dump","");
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"-d","");
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,"Dump the combined graph file (useful for debugging)","");
  local_4f0 = 0;
  local_4f8 = (__buckets_ptr)(local_33 + 1);
  local_4e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:507:10)>
              ::_M_invoke;
  local_4e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:507:10)>
              ::_M_manager;
  psVar15 = (string *)
            ::wasm::Options::add
                      (psVar15,(string *)local_1a0,(string *)local_318,(string *)local_180,
                       (Arguments)&local_f0,(function *)0x0,SUB81(&local_4f8,0));
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"INFILE","");
  local_4d8._M_max_load_factor = 0.0;
  local_4d8._4_4_ = 0;
  local_4d8._M_next_resize = 0;
  local_4c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:510:21)>
              ::_M_invoke;
  local_4c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:510:21)>
              ::_M_manager;
  ::wasm::Options::add_positional(psVar15,(Arguments)local_2f8,(function *)0x1);
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)(&local_4d8,&local_4d8,3);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_4e8 != (code *)0x0) {
    (*local_4e8)(&local_4f8,&local_4f8,3);
  }
  if (local_180[0] != local_170) {
    operator_delete(local_180[0],local_170[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  ppuVar2 = &wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  psVar3 = &graph.nodes._M_h._M_bucket_count;
  if (local_508 != (code *)0x0) {
    (*local_508)(&local_518,&local_518,3);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  if (local_528 != (code *)0x0) {
    (*local_528)(&local_538,&local_538,3);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  if (local_260[0] != local_250) {
    operator_delete(local_260[0],local_250[0] + 1);
  }
  __dest = &graph.reached._M_h._M_single_bucket;
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-metadce.cpp:489:10)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  if ((anon_union_16_6_a0c44491_for_Value_2 *)input.field_2._8_8_ != &outside.field_1) {
    operator_delete((void *)input.field_2._8_8_,outside.field_1.str.str._M_len + 1);
  }
  if (local_90 != &graphInput._M_string_length) {
    operator_delete(local_90,graphInput._M_string_length + 1);
  }
  if ((size_type *)WasmMetaDCEOption.field_2._8_8_ != &input._M_string_length) {
    operator_delete((void *)WasmMetaDCEOption.field_2._8_8_,input._M_string_length + 1);
  }
  if (node.name.super_IString.str._M_str != (char *)0x0) {
    (*(code *)node.name.super_IString.str._M_str)(auStack_68,auStack_68,3);
  }
  if (passes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&id.super_IString.str._M_str) {
    operator_delete(passes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (ulong)(id.super_IString.str._M_str + 1));
  }
  if ((size_type *)options._352_8_ != psVar3) {
    operator_delete((void *)options._352_8_,graph.nodes._M_h._M_bucket_count + 1);
  }
  if (local_cb8 != (undefined1  [8])ppuVar2) {
    operator_delete((void *)local_cb8,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Options::parse((int)&wasm + 0x340,(char **)(ulong)(uint)argc);
  if (graphFile._M_dataplus._M_p == (pointer)0x0) {
    ::wasm::Fatal::Fatal((Fatal *)local_cb8);
    ::wasm::Fatal::operator<<((Fatal *)local_cb8,(char (*) [24])"no graph file provided.");
    ::wasm::Fatal::~Fatal((Fatal *)local_cb8);
  }
  local_cb8 = (undefined1  [8])ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"infile","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,(key_type *)local_cb8);
  ::wasm::read_file<std::__cxx11::string>
            ((string *)(WasmMetaDCEOption.field_2._M_local_buf + 8),(BinaryOption)pmVar16);
  if (local_cb8 != (undefined1  [8])ppuVar2) {
    operator_delete((void *)local_cb8,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Module::Module((Module *)local_cb8);
  ::wasm::ToolOptions::applyFeatures
            ((ToolOptions *)&wasm.tagsMap._M_h._M_single_bucket,(Module *)local_cb8);
  if ((char)wasm.tagsMap._M_h._M_single_bucket == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"reading...\n",0xb);
  }
  stack0xfffffffffffffb64 = 0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = local_31;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  options._352_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"infile","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,(key_type *)&options.enabledFeatures);
  pcVar5 = (pmVar16->_M_dataplus)._M_p;
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d8,pcVar5,pcVar5 + pmVar16->_M_string_length);
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
  ::wasm::ModuleReader::read
            (&passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_2d8,local_cb8,local_2b8);
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if ((size_type *)options._352_8_ != psVar3) {
    operator_delete((void *)options._352_8_,graph.nodes._M_h._M_bucket_count + 1);
  }
  if ((options._169_1_ != '\0') &&
     (cVar13 = ::wasm::WasmValidator::validate((Module *)&options.enabledFeatures,(uint)local_cb8),
     cVar13 == '\0')) {
    poVar22 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)local_cb8);
    options.enabledFeatures.features._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,(char *)&options.enabledFeatures,1);
    ::wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    ::wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [26])"error in validating input");
    ::wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
  }
  ::wasm::read_file<std::__cxx11::string>((string *)&local_90,(BinaryOption)&local_160);
  local_268 = strdup((char *)local_90);
  input.field_2._8_4_ = 3;
  outside.type = String;
  outside._4_4_ = 0;
  json::Value::parse((Value *)((long)&input.field_2 + 8),local_268);
  auVar25 = ::wasm::IString::interned(4,"name",0);
  graphFile.field_2._8_8_ = auVar25._8_8_;
  x_01.str = (string_view)::wasm::IString::interned(7,"reaches",0);
  x_02.str = (string_view)::wasm::IString::interned(4,"root",0);
  x_03.str = (string_view)::wasm::IString::interned(6,"export",0);
  x_04.str = (string_view)::wasm::IString::interned(6,"import",0);
  MetaDCEGraph::MetaDCEGraph((MetaDCEGraph *)&options.enabledFeatures,(Module *)local_cb8);
  if (input.field_2._8_4_ != 2) {
    ::wasm::Fatal::Fatal
              ((Fatal *)&passes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::wasm::Fatal::operator<<
              ((Fatal *)&passes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char (*) [67])"input graph must be a JSON array of nodes. see --help for the form");
LAB_0010c17e:
    ::wasm::Fatal::~Fatal
              ((Fatal *)&passes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  lVar23 = *(long *)(outside._0_8_ + 8) - *(long *)outside._0_8_;
  if (lVar23 != 0) {
    lVar23 = lVar23 >> 4;
    local_270 = lVar23 + (ulong)(lVar23 == 0);
    uVar24 = 0;
    do {
      if (input.field_2._8_4_ != 2) {
LAB_0010b9e1:
        __assert_fail("isArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/json.h"
                      ,0x16d,"Ref &json::Value::operator[](unsigned int)");
      }
      lVar23 = (uVar24 & 0xffffffff) * 0x10;
      pVVar6 = *(Value **)(*(long *)outside._0_8_ + lVar23);
      this_00 = *(long *)(*(long *)outside._0_8_ + 8 + lVar23);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00)->_M_use_count + 1;
        }
      }
      local_278 = uVar24;
      if (pVVar6->type != Object) {
        ::wasm::Fatal::Fatal
                  ((Fatal *)&passes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&passes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char (*) [67])
                   "nodes in input graph must be JSON objects. see --help for the form");
        goto LAB_0010c17e;
      }
      x.str._M_str = (char *)graphFile.field_2._8_8_;
      x.str._M_len = auVar25._0_8_;
      bVar14 = json::Value::has(pVVar6,x);
      if (!bVar14) {
        ::wasm::Fatal::Fatal
                  ((Fatal *)&passes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&passes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char (*) [63])"nodes in input graph must have a name. see --help for the form");
        goto LAB_0010c17e;
      }
      x_00.str._M_str = (char *)graphFile.field_2._8_8_;
      x_00.str._M_len = auVar25._0_8_;
      pRVar17 = json::Value::operator[](pVVar6,x_00);
      peVar7 = (pRVar17->super_shared_ptr<json::Value>).
               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar7->type != String) {
LAB_0010bac3:
        __assert_fail("isString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/json.h"
                      ,0xb3,"IString &json::Value::getIString()");
      }
      auStack_68 = (undefined1  [8])(peVar7->field_1).str.str._M_len;
      node.name.super_IString.str._M_len = (size_t)(peVar7->field_1).str.str._M_str;
      node.name.super_IString.str._M_str = (char *)0x0;
      node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar14 = json::Value::has(pVVar6,x_01);
      if (bVar14) {
        pRVar17 = json::Value::operator[](pVVar6,x_01);
        this = (pRVar17->super_shared_ptr<json::Value>).
               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(pRVar17->super_shared_ptr<json::Value>).
                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->_M_use_count + 1;
          }
        }
        graphInput.field_2._8_8_ = this_00;
        if (this->type != Array) {
          ::wasm::Fatal::Fatal
                    ((Fatal *)&passes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Fatal::operator<<
                    ((Fatal *)&passes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (char (*) [55])"node.reaches must be an array. see --help for the form");
          goto LAB_0010c17e;
        }
        sVar18 = json::Value::size(this);
        if (sVar18 != 0) {
          uVar24 = 0;
          do {
            if (this->type != Array) goto LAB_0010b9e1;
            pRVar8 = (((this->field_1).arr)->
                     super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            piVar9 = (int *)pRVar8[uVar24 & 0xffffffff].super_shared_ptr<json::Value>.
                            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var10 = pRVar8[uVar24 & 0xffffffff].super_shared_ptr<json::Value>.
                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              }
            }
            if (*piVar9 != 0) {
              ::wasm::Fatal::Fatal
                        ((Fatal *)&passes.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::wasm::Fatal::operator<<
                        ((Fatal *)&passes.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (char (*) [60])
                         "node.reaches items must be strings. see --help for the form");
              goto LAB_0010c17e;
            }
            pcVar11 = *(char **)(piVar9 + 4);
            unique0x1000122f = *(IString *)(piVar9 + 2);
            if (node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start ==
                node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                        ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                         &node.name.super_IString.str._M_str,
                         (iterator)
                         node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (Name *)&passes.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              ((node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_len =
                   *(size_t *)(piVar9 + 2);
              ((node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar11;
              node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
            }
            uVar24 = uVar24 + 1;
          } while (sVar18 != uVar24);
        }
        this_00 = graphInput.field_2._8_8_;
        if (node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     node.reaches.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      bVar14 = json::Value::has(pVVar6,x_02);
      if (bVar14) {
        pRVar17 = json::Value::operator[](pVVar6,x_02);
        peVar7 = (pRVar17->super_shared_ptr<json::Value>).
                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var10 = (pRVar17->super_shared_ptr<json::Value>).
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          }
        }
        if ((peVar7->type != Bool) || ((peVar7->field_1).boo == false)) {
          ::wasm::Fatal::Fatal
                    ((Fatal *)&passes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Fatal::operator<<
                    ((Fatal *)&passes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (char (*) [63])"node.root, if it exists, must be true. see --help for the form"
                    );
          goto LAB_0010c17e;
        }
        pp_Var4 = &graph.nodes._M_h._M_single_bucket;
        passes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pp_Var4;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)pp_Var4,auStack_68,
                   &passes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
        }
      }
      bVar14 = json::Value::has(pVVar6,x_03);
      if (bVar14) {
        pRVar17 = json::Value::operator[](pVVar6,x_03);
        peVar7 = (pRVar17->super_shared_ptr<json::Value>).
                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var10 = (pRVar17->super_shared_ptr<json::Value>).
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          }
        }
        if (peVar7->type != String) {
          ::wasm::Fatal::Fatal
                    ((Fatal *)&passes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Fatal::operator<<
                    ((Fatal *)&passes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (char (*) [69])
                     "node.export, if it exists, must be a string. see --help for the form");
          goto LAB_0010c17e;
        }
        unique0x1000123f = peVar7->field_1;
        pmVar19 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&graph.roots._M_h._M_single_bucket,
                               (key_type *)
                               &passes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (pmVar19->super_IString).str._M_len = (size_t)auStack_68;
        (pmVar19->super_IString).str._M_str = (char *)node.name.super_IString.str._M_len;
        if (peVar7->type != String) goto LAB_0010bac3;
        sVar18 = (peVar7->field_1).str.str._M_len;
        pcVar11 = (peVar7->field_1).str.str._M_str;
        pmVar19 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&graph.tagToDCENode._M_h._M_single_bucket,(key_type *)auStack_68);
        (pmVar19->super_IString).str._M_len = sVar18;
        (pmVar19->super_IString).str._M_str = pcVar11;
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
        }
      }
      bVar14 = json::Value::has(pVVar6,x_04);
      if (bVar14) {
        pRVar17 = json::Value::operator[](pVVar6,x_04);
        pVVar6 = (pRVar17->super_shared_ptr<json::Value>).
                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var10 = (pRVar17->super_shared_ptr<json::Value>).
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          }
        }
        if ((pVVar6->type == Array) && (sVar18 = json::Value::size(pVVar6), sVar18 == 2)) {
          if (pVVar6->type != Array) goto LAB_0010b9e1;
          pRVar8 = (((pVVar6->field_1).arr)->
                   super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar9 = (int *)(pRVar8->super_shared_ptr<json::Value>).
                          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((*piVar9 == 0) &&
             (piVar12 = (int *)pRVar8[1].super_shared_ptr<json::Value>.
                               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             *piVar12 == 0)) {
            join_0x00000010_0x00000000_ =
                 (IString)MetaDCEGraph::getImportId
                                    ((MetaDCEGraph *)&options.enabledFeatures,
                                     (Name)((IString *)(piVar9 + 2))->str,
                                     (Name)((IString *)(piVar12 + 2))->str);
            pmVar19 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&graph.DCENodeToTag._M_h._M_single_bucket,
                                   (key_type *)
                                   &passes.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            (pmVar19->super_IString).str._M_len = (size_t)auStack_68;
            (pmVar19->super_IString).str._M_str = (char *)node.name.super_IString.str._M_len;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
            }
            goto LAB_0010b5f0;
          }
        }
        ::wasm::Fatal::Fatal
                  ((Fatal *)&passes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&passes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char (*) [84])
                   "node.import, if it exists, must be an array of two strings. see --help for the form"
                  );
        goto LAB_0010c17e;
      }
LAB_0010b5f0:
      pmVar20 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&options.enabledFeatures,(key_type *)auStack_68);
      (pmVar20->name).super_IString.str._M_len = (size_t)auStack_68;
      (pmVar20->name).super_IString.str._M_str = (char *)node.name.super_IString.str._M_len;
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator=
                (&pmVar20->reaches,
                 (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &node.name.super_IString.str._M_str);
      if (node.name.super_IString.str._M_str != (char *)0x0) {
        operator_delete(node.name.super_IString.str._M_str,
                        (long)node.reaches.
                              super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)node.name.super_IString.str._M_str);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      uVar24 = local_278 + 1;
    } while (uVar24 != local_270);
  }
  MetaDCEGraph::scanWebAssembly((MetaDCEGraph *)&options.enabledFeatures);
  if (local_33[1] == '\x01') {
    MetaDCEGraph::dump((MetaDCEGraph *)&options.enabledFeatures);
  }
  MetaDCEGraph::deadCodeElimination((MetaDCEGraph *)&options.enabledFeatures);
  MetaDCEGraph::apply((MetaDCEGraph *)&options.enabledFeatures);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&id.super_IString.str._M_str;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"output","");
  __k = &passes.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&options,(key_type *)__k);
  if (passes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&id.super_IString.str._M_str) {
    __k = (pointer *)(id.super_IString.str._M_str + 1);
    operator_delete(passes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)__k);
  }
  if (cVar21._M_node != (_Base_ptr)&options.field_0x8) {
    passes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(passes._19_8_ << 0x18);
    id.super_IString.str._M_len = (size_t)&local_488;
    id.super_IString.str._M_str = (char *)0x0;
    local_488 = 0;
    local_470 = 0;
    local_468 = 0;
    local_450 = 0;
    local_448 = 0;
    passes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = local_33[0];
    passes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = local_31;
    ppcVar1 = &node.name.super_IString.str._M_str;
    local_478 = &local_468;
    local_458 = &local_448;
    auStack_68 = (undefined1  [8])ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_68,"output","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&options,(key_type *)auStack_68);
    pcVar5 = (pmVar16->_M_dataplus)._M_p;
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,pcVar5,pcVar5 + pmVar16->_M_string_length);
    __k = (pointer *)local_cb8;
    ::wasm::ModuleWriter::write
              (&passes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,__k,local_298);
    if (local_298[0] != local_288) {
      __k = (pointer *)(local_288[0] + 1);
      operator_delete(local_298[0],(ulong)__k);
    }
    if (auStack_68 != (undefined1  [8])ppcVar1) {
      __k = (pointer *)(node.name.super_IString.str._M_str + 1);
      operator_delete((void *)auStack_68,(ulong)__k);
    }
    if (local_458 != &local_448) {
      __k = (pointer *)(CONCAT71(uStack_447,local_448) + 1);
      operator_delete(local_458,(ulong)__k);
    }
    if (local_478 != &local_468) {
      __k = (pointer *)(CONCAT71(uStack_467,local_468) + 1);
      operator_delete(local_478,(ulong)__k);
    }
    if ((undefined1 *)id.super_IString.str._M_len != &local_488) {
      __k = (pointer *)(CONCAT71(uStack_487,local_488) + 1);
      operator_delete((void *)id.super_IString.str._M_len,(ulong)__k);
    }
  }
  MetaDCEGraph::printAllUnused((MetaDCEGraph *)&options.enabledFeatures);
  free(local_268);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&graph.nameIndex);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.DCENodeToTag._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.DCENodeToGlobal._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.DCENodeToFunction._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.DCENodeToExport._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.tagToDCENode._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.globalToDCENode._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.functionToDCENode._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.exportToDCENode._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&graph.roots._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&graph.nodes._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&options.enabledFeatures);
  json::Value::free((Value *)((long)&input.field_2 + 8),__k);
  if (local_90 != &graphInput._M_string_length) {
    operator_delete(local_90,graphInput._M_string_length + 1);
  }
  ::wasm::Module::~Module((Module *)local_cb8);
  if ((size_type *)WasmMetaDCEOption.field_2._8_8_ != &input._M_string_length) {
    operator_delete((void *)WasmMetaDCEOption.field_2._8_8_,input._M_string_length + 1);
  }
  if (options.passOptions.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               options.passOptions.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&options.passOptions.arguments._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&options.passOptions.ignoreImplicitTraps);
  ::wasm::Options::~Options((Options *)&wasm.tagsMap._M_h._M_single_bucket);
  if (local_f0 != &WasmMetaDCEOption._M_string_length) {
    operator_delete(local_f0,WasmMetaDCEOption._M_string_length + 1);
  }
  if (local_160 != &graphFile._M_string_length) {
    operator_delete(local_160,
                    CONCAT71(graphFile._M_string_length._1_7_,(undefined1)graphFile._M_string_length
                            ) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_4b8);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::vector<std::string> passes;
  bool emitBinary = true;
  bool debugInfo = false;
  std::string graphFile;
  bool dump = false;

  const std::string WasmMetaDCEOption = "wasm-opt options";

  ToolOptions options(
    "wasm-metadce",
    "This tool performs dead code elimination (DCE) on a larger space "
    "that the wasm module is just a part of. For example, if you have "
    "JS and wasm that are connected, this can DCE the combined graph. "
    "By doing so, it is able to eliminate wasm module exports, which "
    "otherwise regular optimizations cannot.\n\n"
    "This tool receives a representation of the reachability graph "
    "that the wasm module resides in, which contains abstract nodes "
    "and connections showing what they reach. Some of those nodes "
    "can represent the wasm module's imports and exports. The tool "
    "then completes the graph by adding the internal parts of the "
    "module, and does DCE on the entire thing.\n\n"
    "This tool will output a wasm module with dead code eliminated, "
    "and metadata describing the things in the rest of the graph "
    "that can be eliminated as well.\n\n"
    "The graph description file should represent the graph in the following "
    "JSON-like notation (note, this is not true JSON, things like "
    "comments, escaping, single-quotes, etc. are not supported):\n\n"
    "  [\n"
    "    {\n"
    "      \"name\": \"entity1\",\n"
    "      \"reaches\": [\"entity2, \"entity3\"],\n"
    "      \"root\": true\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity2\",\n"
    "      \"reaches\": [\"entity1, \"entity4\"]\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity3\",\n"
    "      \"reaches\": [\"entity1\"],\n"
    "      \"export\": \"export1\"\n"
    "    },\n"
    "    {\n"
    "      \"name\": \"entity4\",\n"
    "      \"import\": [\"module\", \"import1\"]\n"
    "    },\n"
    "  ]\n\n"
    "Each entity has a name and an optional list of the other "
    "entities it reaches. It can also be marked as a root, "
    "export (with the export string), or import (with the "
    "module and import strings). DCE then computes what is "
    "reachable from the roots.");

  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmMetaDCEOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--graph-file",
         "-f",
         "Filename of the graph description file",
         WasmMetaDCEOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { graphFile = argument; })
    .add("--dump",
         "-d",
         "Dump the combined graph file (useful for debugging)",
         WasmMetaDCEOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { dump = true; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  if (graphFile.size() == 0) {
    Fatal() << "no graph file provided.";
  }

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyFeatures(wasm);

  {
    if (options.debug) {
      std::cerr << "reading...\n";
    }
    ModuleReader reader;
    reader.setDWARF(debugInfo);
    try {
      reader.read(options.extra["infile"], wasm);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      Fatal() << "error in parsing wasm input";
    }
  }

  if (options.passOptions.validate) {
    if (!WasmValidator().validate(wasm)) {
      std::cout << wasm << '\n';
      Fatal() << "error in validating input";
    }
  }

  auto graphInput(read_file<std::string>(graphFile, Flags::Text));
  auto* copy = strdup(graphInput.c_str());
  json::Value outside;
  outside.parse(copy);

  // parse the JSON into our graph, doing all the JSON parsing here, leaving
  // the abstract computation for the class itself
  const json::IString NAME("name");
  const json::IString REACHES("reaches");
  const json::IString ROOT("root");
  const json::IString EXPORT("export");
  const json::IString IMPORT("import");

  MetaDCEGraph graph(wasm);

  if (!outside.isArray()) {
    Fatal()
      << "input graph must be a JSON array of nodes. see --help for the form";
  }
  auto size = outside.size();
  for (size_t i = 0; i < size; i++) {
    json::Ref ref = outside[i];
    if (!ref->isObject()) {
      Fatal()
        << "nodes in input graph must be JSON objects. see --help for the form";
    }
    if (!ref->has(NAME)) {
      Fatal()
        << "nodes in input graph must have a name. see --help for the form";
    }
    DCENode node(ref[NAME]->getIString());
    if (ref->has(REACHES)) {
      json::Ref reaches = ref[REACHES];
      if (!reaches->isArray()) {
        Fatal() << "node.reaches must be an array. see --help for the form";
      }
      auto size = reaches->size();
      for (size_t j = 0; j < size; j++) {
        json::Ref name = reaches[j];
        if (!name->isString()) {
          Fatal()
            << "node.reaches items must be strings. see --help for the form";
        }
        node.reaches.push_back(name->getIString());
      }
    }
    if (ref->has(ROOT)) {
      json::Ref root = ref[ROOT];
      if (!root->isBool() || !root->getBool()) {
        Fatal()
          << "node.root, if it exists, must be true. see --help for the form";
      }
      graph.roots.insert(node.name);
    }
    if (ref->has(EXPORT)) {
      json::Ref exp = ref[EXPORT];
      if (!exp->isString()) {
        Fatal() << "node.export, if it exists, must be a string. see --help "
                   "for the form";
      }
      graph.exportToDCENode[exp->getIString()] = node.name;
      graph.DCENodeToExport[node.name] = exp->getIString();
    }
    if (ref->has(IMPORT)) {
      json::Ref imp = ref[IMPORT];
      if (!imp->isArray() || imp->size() != 2 || !imp[0]->isString() ||
          !imp[1]->isString()) {
        Fatal() << "node.import, if it exists, must be an array of two "
                   "strings. see --help for the form";
      }
      auto id = graph.getImportId(imp[0]->getIString(), imp[1]->getIString());
      graph.importIdToDCENode[id] = node.name;
    }
    // TODO: optimize this copy with a clever move
    graph.nodes[node.name] = node;
  }

  // The external graph is now populated. Scan the module
  graph.scanWebAssembly();

  // Debug dump the graph, if requested
  if (dump) {
    graph.dump();
  }

  // Perform the DCE
  graph.deadCodeElimination();

  // Apply to the wasm
  graph.apply();

  if (options.extra.count("output") > 0) {
    ModuleWriter writer;
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    writer.write(wasm, options.extra["output"]);
  }

  // Print out everything that we found is removable, the outside might use that
  graph.printAllUnused();

  // Clean up
  free(copy);
}